

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O1

char * lws_get_peer_simple_fd(lws_sockfd_type fd,char *name,size_t namelen)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  socklen_t len;
  lws_sockaddr46 sa46;
  socklen_t local_24;
  lws_sockaddr46 local_20;
  
  local_24 = 0x10;
  iVar1 = getpeername(fd,(sockaddr *)&local_20.sa4,&local_24);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    lws_snprintf(name,namelen,"getpeername: %s",pcVar3);
  }
  else {
    lws_sa46_write_numeric_address(&local_20,name,namelen);
  }
  return name;
}

Assistant:

const char *
lws_get_peer_simple_fd(lws_sockfd_type fd, char *name, size_t namelen)
{
	lws_sockaddr46 sa46;
	socklen_t len = sizeof(sa46);

	if (getpeername(fd, (struct sockaddr *)&sa46, &len) < 0) {
		lws_snprintf(name, namelen, "getpeername: %s",
				strerror(LWS_ERRNO));
		return name;
	}

	lws_sa46_write_numeric_address(&sa46, name, namelen);

	return name;
}